

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cc
# Opt level: O0

string * OB::String::replace(string *__return_storage_ptr__,string *str,string *key,string *val)

{
  ulong uVar1;
  string *psVar2;
  size_t pos;
  string *val_local;
  string *key_local;
  string *str_local;
  
  while( true ) {
    uVar1 = std::__cxx11::string::find((string *)str,(ulong)key);
    if (uVar1 == 0xffffffffffffffff) break;
    psVar2 = (string *)std::__cxx11::string::size();
    std::__cxx11::string::replace((ulong)str,uVar1,psVar2);
    std::__cxx11::string::size();
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  return __return_storage_ptr__;
}

Assistant:

std::string replace(std::string str, std::string const& key, std::string const& val)
{
  std::size_t pos {0};

  for (;;)
  {
    pos = str.find(key, pos);

    if (pos == std::string::npos)
    {
      break;
    }

    str.replace(pos, key.size(), val);
    pos += val.size();
  }

  return str;
}